

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewIf::Update(DataViewIf *this,DataModel *model)

{
  bool bVar1;
  Element *element;
  DataExpression *this_00;
  PropertyMap *this_01;
  size_t sVar2;
  bool bVar3;
  Variant variant;
  DataExpressionInterface expr_interface;
  Property local_70;
  
  Variant::Variant(&variant);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&expr_interface,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&expr_interface,&variant);
    if (bVar1) {
      bVar1 = Variant::Get<bool>(&variant,false);
      this_01 = Element::GetLocalStyleProperties(element);
      local_70.value.type._0_1_ = 0x15;
      sVar2 = robin_hood::detail::
              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              ::count(this_01,(key_type *)&local_70);
      bVar3 = (sVar2 != 0) == bVar1;
      if (bVar3) {
        if (bVar1) {
          Element::RemoveProperty(element,Display);
        }
        else {
          Property::Property<Rml::Style::Display,Rml::Style::Display>(&local_70,None);
          Element::SetProperty(element,Display,&local_70);
          Property::~Property(&local_70);
        }
      }
      goto LAB_0026ef4e;
    }
  }
  bVar3 = false;
LAB_0026ef4e:
  Variant::~Variant(&variant);
  return bVar3;
}

Assistant:

bool DataViewIf::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_visible = (element->GetLocalStyleProperties().count(PropertyId::Display) == 0);
		if (is_visible != value)
		{
			if (value)
				element->RemoveProperty(PropertyId::Display);
			else
				element->SetProperty(PropertyId::Display, Property(Style::Display::None));
			result = true;
		}
	}
	return result;
}